

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O0

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::__cxx11::string>
               (AVisitor<hiberlite::KillChildren> *ar,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *v,uint param_3)

{
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_128;
  stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  body;
  uint param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_local;
  AVisitor<hiberlite::KillChildren> *ar_local;
  
  body.stream._44_4_ = param_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"items",&local_91);
  stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::stl_stream_adapter(&local_d8,v);
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::collection_nvp((collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_70,(string *)local_90,&local_d8);
  stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stl_stream_adapter(&local_d8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::collection_nvp(&local_128,
                   (collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_70);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_128);
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~collection_nvp(&local_128);
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~collection_nvp((collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_70);
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}